

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O1

void __thiscall Quest_Context::BeginState(Quest_Context *this,string *name,State *state)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  int iVar3;
  iterator __position;
  ulong uVar4;
  _Base_ptr p_Var5;
  Dialog *pDVar6;
  _Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Dialog>_>_> _Var7;
  variant *pvVar8;
  _Elt_pointer this_00;
  short sVar9;
  _Elt_pointer pAVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Dialog>_>_>,_bool> pVar11;
  string function_name;
  Action action;
  _Map_pointer local_230;
  string local_220;
  _Elt_pointer local_200;
  Dialog *local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  _Rb_tree<short,std::pair<short_const,std::shared_ptr<Dialog>>,std::_Select1st<std::pair<short_const,std::shared_ptr<Dialog>>>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Dialog>>>>
  *local_1c8;
  _Elt_pointer local_1c0;
  Action local_1b8;
  
  std::__cxx11::string::_M_assign((string *)&this->state_desc);
  __position._M_node = (this->progress)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->progress)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    do {
      iVar3 = std::__cxx11::string::compare((char *)(__position._M_node + 1));
      if ((iVar3 == 0) ||
         (iVar3 = std::__cxx11::string::compare((char *)(__position._M_node + 1)), iVar3 == 0)) {
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
      else {
        __position = std::
                     _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,short>,std::_Select1st<std::pair<std::__cxx11::string_const,short>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,short>>>
                     ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,short>,std::_Select1st<std::pair<std::__cxx11::string_const,short>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,short>>>
                                         *)&this->progress,__position);
      }
    } while ((_Rb_tree_header *)__position._M_node != p_Var1);
  }
  local_1c8 = (_Rb_tree<short,std::pair<short_const,std::shared_ptr<Dialog>>,std::_Select1st<std::pair<short_const,std::shared_ptr<Dialog>>>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Dialog>>>>
               *)&this->dialogs;
  std::
  _Rb_tree<short,_std::pair<const_short,_std::shared_ptr<Dialog>_>,_std::_Select1st<std::pair<const_short,_std::shared_ptr<Dialog>_>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Dialog>_>_>_>
  ::clear((_Rb_tree<short,_std::pair<const_short,_std::shared_ptr<Dialog>_>,_std::_Select1st<std::pair<const_short,_std::shared_ptr<Dialog>_>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Dialog>_>_>_>
           *)local_1c8);
  if ((this->quest->quest->info).disabled == false) {
    pAVar10 = (state->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    local_1c0 = (state->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pAVar10 != local_1c0) {
      local_200 = (state->actions).
                  super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>._M_impl.
                  super__Deque_impl_data._M_start._M_last;
      local_230 = (state->actions).
                  super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node;
      p_Var1 = &(this->dialogs)._M_t._M_impl.super__Rb_tree_header;
      do {
        EOPlus::Action::Action(&local_1b8,pAVar10);
        local_1e8[0] = local_1d8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1e8,local_1b8.expr.function._M_dataplus._M_p,
                   local_1b8.expr.function._M_dataplus._M_p +
                   local_1b8.expr.function._M_string_length);
        iVar3 = std::__cxx11::string::compare((char *)local_1e8);
        if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)local_1e8), iVar3 == 0))
        {
          uVar4 = (long)local_1b8.expr.args.
                        super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur -
                  (long)local_1b8.expr.args.
                        super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first >> 6;
          this_00 = local_1b8.expr.args.
                    super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
          if (7 < uVar4) {
            this_00 = local_1b8.expr.args.
                      super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar4 >> 3] +
                      uVar4 + (uVar4 >> 3) * -8;
          }
          iVar3 = util::variant::GetInt(this_00);
          sVar9 = (short)iVar3;
          p_Var2 = (this->dialogs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var5 = &p_Var1->_M_header;
          for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
              p_Var2 = (&p_Var2->_M_left)[(short)*(size_t *)(p_Var2 + 1) < sVar9]) {
            if (sVar9 <= (short)*(size_t *)(p_Var2 + 1)) {
              p_Var5 = p_Var2;
            }
          }
          _Var7._M_node = &p_Var1->_M_header;
          if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
             (_Var7._M_node = p_Var5, sVar9 < (short)p_Var5[1]._M_color)) {
            _Var7._M_node = &p_Var1->_M_header;
          }
          if ((_Rb_tree_header *)_Var7._M_node == p_Var1) {
            pDVar6 = (Dialog *)operator_new(0x80);
            Dialog::Dialog(pDVar6);
            local_1f8 = pDVar6;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Dialog*>
                      (&_Stack_1f0,pDVar6);
            local_220._M_string_length = (size_type)local_1f8;
            local_220.field_2._M_allocated_capacity = (size_type)_Stack_1f0._M_pi;
            local_1f8 = (Dialog *)0x0;
            _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_220._M_dataplus._M_p._0_2_ = sVar9;
            pVar11 = std::
                     _Rb_tree<short,std::pair<short_const,std::shared_ptr<Dialog>>,std::_Select1st<std::pair<short_const,std::shared_ptr<Dialog>>>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Dialog>>>>
                     ::_M_emplace_unique<std::pair<short,std::shared_ptr<Dialog>>>
                               (local_1c8,(pair<short,_std::shared_ptr<Dialog>_> *)&local_220);
            _Var7 = pVar11.first._M_node;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_220.field_2._M_allocated_capacity !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_220.field_2._M_allocated_capacity);
            }
            if (_Stack_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1f0._M_pi);
            }
          }
          iVar3 = std::__cxx11::string::compare((char *)local_1e8);
          if (iVar3 == 0) {
            uVar4 = ((long)local_1b8.expr.args.
                           super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                           super__Deque_impl_data._M_start._M_cur -
                     (long)local_1b8.expr.args.
                           super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                           super__Deque_impl_data._M_start._M_first >> 6) + 1;
            if (uVar4 < 8) {
              pvVar8 = local_1b8.expr.args.
                       super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur + 1;
            }
            else {
              pvVar8 = local_1b8.expr.args.
                       super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                       super__Deque_impl_data._M_start._M_node[uVar4 >> 3] +
                       uVar4 + (uVar4 >> 3) * -8;
            }
            pDVar6 = (Dialog *)_Var7._M_node[1]._M_parent;
            util::variant::GetString_abi_cxx11_(&local_220,pvVar8);
            Dialog::AddPage(pDVar6,&local_220);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)local_1e8);
            if (iVar3 != 0) goto LAB_001864b5;
            uVar4 = ((long)local_1b8.expr.args.
                           super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                           super__Deque_impl_data._M_start._M_cur -
                     (long)local_1b8.expr.args.
                           super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                           super__Deque_impl_data._M_start._M_first >> 6) + 1;
            if (uVar4 < 8) {
              pvVar8 = local_1b8.expr.args.
                       super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur + 1;
            }
            else {
              pvVar8 = local_1b8.expr.args.
                       super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                       super__Deque_impl_data._M_start._M_node[uVar4 >> 3] +
                       uVar4 + (uVar4 >> 3) * -8;
            }
            pDVar6 = (Dialog *)_Var7._M_node[1]._M_parent;
            iVar3 = util::variant::GetInt(pvVar8);
            uVar4 = ((long)local_1b8.expr.args.
                           super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                           super__Deque_impl_data._M_start._M_cur -
                     (long)local_1b8.expr.args.
                           super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                           super__Deque_impl_data._M_start._M_first >> 6) + 2;
            if (uVar4 < 8) {
              pvVar8 = local_1b8.expr.args.
                       super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur + 2;
            }
            else {
              pvVar8 = local_1b8.expr.args.
                       super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                       super__Deque_impl_data._M_start._M_node[uVar4 >> 3] +
                       uVar4 + (uVar4 >> 3) * -8;
            }
            util::variant::GetString_abi_cxx11_(&local_220,pvVar8);
            Dialog::AddLink(pDVar6,iVar3,&local_220);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT62(local_220._M_dataplus._M_p._2_6_,(short)local_220._M_dataplus._M_p) !=
              &local_220.field_2) {
            operator_delete((undefined1 *)
                            CONCAT62(local_220._M_dataplus._M_p._2_6_,
                                     (short)local_220._M_dataplus._M_p),
                            (ulong)(local_220.field_2._M_allocated_capacity + 1));
          }
        }
LAB_001864b5:
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        std::deque<util::variant,_std::allocator<util::variant>_>::~deque(&local_1b8.expr.args);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8.expr.function._M_dataplus._M_p != &local_1b8.expr.function.field_2) {
          operator_delete(local_1b8.expr.function._M_dataplus._M_p,
                          local_1b8.expr.function.field_2._M_allocated_capacity + 1);
        }
        std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque(&local_1b8.expr.scopes);
        std::deque<util::variant,_std::allocator<util::variant>_>::~deque(&local_1b8.cond_expr.args)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8.cond_expr.function._M_dataplus._M_p !=
            &local_1b8.cond_expr.function.field_2) {
          operator_delete(local_1b8.cond_expr.function._M_dataplus._M_p,
                          local_1b8.cond_expr.function.field_2._M_allocated_capacity + 1);
        }
        std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque
                  (&local_1b8.cond_expr.scopes);
        pAVar10 = pAVar10 + 1;
        if (pAVar10 == local_200) {
          pAVar10 = local_230[1];
          local_230 = local_230 + 1;
          local_200 = pAVar10 + 1;
        }
      } while (pAVar10 != local_1c0);
    }
  }
  return;
}

Assistant:

void Quest_Context::BeginState(const std::string& name, const EOPlus::State& state)
{
	this->state_desc = state.desc;

	for (auto it = this->progress.begin(); it != this->progress.end(); )
	{
		if (it->first != "d" && it->first != "c")
			it = this->progress.erase(it);
		else
			++it;
	}

	this->dialogs.clear();

	if (this->quest->Disabled())
		return;

	UTIL_FOREACH(state.actions, action)
	{
		std::string function_name = action.expr.function;

		if (function_name == "addnpctext" || function_name == "addnpcinput")
		{
			short vendor_id = int(action.expr.args[0]);
			auto it = this->dialogs.find(vendor_id);

			if (it == this->dialogs.end())
				it = this->dialogs.insert(std::make_pair(vendor_id, std::shared_ptr<Dialog>(new Dialog()))).first;

			if (function_name == "addnpctext")
				it->second->AddPage(std::string(action.expr.args[1]));
			else if (function_name == "addnpcinput")
				it->second->AddLink(int(action.expr.args[1]), std::string(action.expr.args[2]));
		}
	}
}